

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::
RangeEquals<std::__cxx11::list<long,std::allocator<long>>&,std::vector<int,std::allocator<int>>&>
          (Assert *this,list<long,_std::allocator<long>_> *expected,
          vector<int,_std::allocator<int>_> *got)

{
  iterator expected_first;
  iterator expected_last;
  iterator got_first;
  iterator got_last;
  string local_40 [32];
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *got_local;
  list<long,_std::allocator<long>_> *expected_local;
  Assert *this_local;
  
  local_20 = got;
  got_local = (vector<int,_std::allocator<int>_> *)expected;
  expected_local = (list<long,_std::allocator<long>_> *)this;
  std::__cxx11::string::string(local_40);
  expected_first =
       std::begin<std::__cxx11::list<long,std::allocator<long>>>
                 ((list<long,_std::allocator<long>_> *)got_local);
  expected_last =
       std::end<std::__cxx11::list<long,std::allocator<long>>>
                 ((list<long,_std::allocator<long>_> *)got_local);
  got_first = std::begin<std::vector<int,std::allocator<int>>>(local_20);
  got_last = std::end<std::vector<int,std::allocator<int>>>(local_20);
  RangeEquals<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (this,(string *)local_40,(_List_iterator<long>)expected_first._M_node,
             (_List_iterator<long>)expected_last._M_node,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)got_first._M_current
             ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)got_last._M_current
            );
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void RangeEquals(ExpectedRange&& expected, GotRange&& got) const
        {
            RangeEquals(std::string(), begin(expected), end(expected), begin(got), end(got));
        }